

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O3

drwav_uint64 drwav_read_s32__mulaw(drwav *pWav,drwav_uint64 samplesToRead,drwav_int32 *pBufferOut)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  drwav_uint64 dVar4;
  size_t i;
  drwav_uint64 dVar5;
  ulong samplesToRead_00;
  drwav_uint64 dVar6;
  uchar sampleData [4096];
  byte local_1038 [4104];
  
  uVar3 = pWav->bitsPerSample;
  if ((uVar3 < 8) || ((uVar3 & 7) != 0)) {
    uVar1 = (pWav->fmt).channels;
    uVar2 = (pWav->fmt).blockAlign;
    uVar3 = uVar2 / uVar1;
    if (uVar2 < uVar1) {
      return 0;
    }
  }
  else {
    uVar3 = uVar3 >> 3;
  }
  dVar6 = 0;
  if (samplesToRead != 0) {
    do {
      samplesToRead_00 = (ulong)(0x1000 / uVar3);
      if (samplesToRead < 0x1000 / uVar3) {
        samplesToRead_00 = samplesToRead;
      }
      dVar4 = drwav_read(pWav,samplesToRead_00,local_1038);
      if (dVar4 == 0) {
        return dVar6;
      }
      if (pBufferOut != (drwav_int32 *)0x0) {
        dVar5 = 0;
        do {
          pBufferOut[dVar5] = (uint)g_drwavMulawTable[local_1038[dVar5]] << 0x10;
          dVar5 = dVar5 + 1;
        } while (dVar4 != dVar5);
      }
      pBufferOut = pBufferOut + dVar4;
      dVar6 = dVar6 + dVar4;
      samplesToRead = samplesToRead - dVar4;
    } while (samplesToRead != 0);
  }
  return dVar6;
}

Assistant:

drwav_uint64 drwav_read_s32__mulaw(drwav* pWav, drwav_uint64 samplesToRead, drwav_int32* pBufferOut)
{
    drwav_uint32 bytesPerSample = drwav_get_bytes_per_sample(pWav);
    if (bytesPerSample == 0) {
        return 0;
    }

    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead = drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData)/bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav_mulaw_to_s32(pBufferOut, sampleData, (size_t)samplesRead);

        pBufferOut       += samplesRead;
        samplesToRead    -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}